

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

ParamsStream<VectorWriter_&,_CAddress::SerParams> * __thiscall
ParamsStream<VectorWriter&,CAddress::SerParams>::operator<<
          (ParamsStream<VectorWriter&,CAddress::SerParams> *this,
          prevector<16U,_unsigned_char,_unsigned_int,_int> *obj)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = obj->_size;
  uVar3 = uVar1 - 0x11;
  if (uVar1 < 0x11) {
    uVar3 = uVar1;
  }
  WriteCompactSize<ParamsStream<VectorWriter&,CAddress::SerParams>>
            ((ParamsStream<VectorWriter_&,_CAddress::SerParams> *)this,(ulong)uVar3);
  uVar1 = obj->_size;
  uVar3 = uVar1 - 0x11;
  if (uVar1 < 0x11) {
    uVar3 = uVar1;
  }
  if (uVar3 != 0) {
    if (0x10 < uVar1) {
      obj = *(prevector<16U,_unsigned_char,_unsigned_int,_int> **)&obj->_union;
    }
    VectorWriter::write(*(VectorWriter **)(this + 8),(int)obj,(void *)(ulong)uVar3,(ulong)uVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (ParamsStream<VectorWriter_&,_CAddress::SerParams> *)this;
  }
  __stack_chk_fail();
}

Assistant:

void write(Span<const std::byte> src) { GetStream().write(src); }